

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

Nf_Man_t * Nf_StoCreate(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  Jf_Par_t *pJVar2;
  Mio_Cell2_t *pMVar3;
  ulong uVar4;
  int iVar5;
  Nf_Man_t *pNVar6;
  Nf_Obj_t *pNVar7;
  void **ppvVar8;
  int *piVar9;
  float *pfVar10;
  Vec_Int_t *vRefs;
  Mio_Library_t *pLib;
  abctime aVar11;
  ulong uVar12;
  long lVar13;
  size_t sVar14;
  long lVar15;
  int iVar16;
  float fVar17;
  timespec ts;
  
  if (0x1e < pPars->nCutNum - 2U) {
    __assert_fail("pPars->nCutNum > 1 && pPars->nCutNum <= NF_CUT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x174,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (4 < pPars->nLutSize - 2U) {
    __assert_fail("pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                  ,0x175,"Nf_Man_t *Nf_StoCreate(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  if (pGia->vCellMapping != (Vec_Int_t *)0x0) {
    piVar9 = pGia->vCellMapping->pArray;
    if (piVar9 != (int *)0x0) {
      free(piVar9);
      pGia->vCellMapping->pArray = (int *)0x0;
    }
    if (pGia->vCellMapping != (Vec_Int_t *)0x0) {
      free(pGia->vCellMapping);
      pGia->vCellMapping = (Vec_Int_t *)0x0;
    }
  }
  if (pGia->pSibls != (int *)0x0) {
    Gia_ManSetPhase(pGia);
  }
  pNVar6 = (Nf_Man_t *)calloc(1,0x120);
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    aVar11 = -1;
  }
  else {
    aVar11 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
  }
  pNVar6->clkStart = aVar11;
  pNVar6->pGia = pGia;
  pNVar6->pPars = pPars;
  pNVar7 = (Nf_Obj_t *)calloc((long)pGia->nObjs,0x40);
  pNVar6->pNfObjs = pNVar7;
  pNVar6->iCur = 2;
  if ((pNVar6->vPages).nCap < 0x100) {
    ppvVar8 = (pNVar6->vPages).pArray;
    if (ppvVar8 == (void **)0x0) {
      ppvVar8 = (void **)malloc(0x800);
    }
    else {
      ppvVar8 = (void **)realloc(ppvVar8,0x800);
    }
    (pNVar6->vPages).pArray = ppvVar8;
    (pNVar6->vPages).nCap = 0x100;
  }
  iVar5 = pGia->nObjs;
  uVar4 = (long)iVar5 * 2;
  iVar16 = (int)uVar4;
  if ((pNVar6->vMapRefs).nCap < iVar16) {
    piVar9 = (pNVar6->vMapRefs).pArray;
    sVar14 = (long)iVar5 << 3;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc(sVar14);
    }
    else {
      piVar9 = (int *)realloc(piVar9,sVar14);
    }
    (pNVar6->vMapRefs).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_0077abd1;
    (pNVar6->vMapRefs).nCap = iVar16;
  }
  if (0 < iVar5) {
    memset((pNVar6->vMapRefs).pArray,0,(uVar4 & 0xffffffff) << 2);
  }
  (pNVar6->vMapRefs).nSize = iVar16;
  iVar5 = pGia->nObjs;
  uVar4 = (long)iVar5 * 2;
  iVar16 = (int)uVar4;
  if ((pNVar6->vFlowRefs).nCap < iVar16) {
    pfVar10 = (pNVar6->vFlowRefs).pArray;
    sVar14 = (long)iVar5 << 3;
    if (pfVar10 == (float *)0x0) {
      pfVar10 = (float *)malloc(sVar14);
    }
    else {
      pfVar10 = (float *)realloc(pfVar10,sVar14);
    }
    (pNVar6->vFlowRefs).pArray = pfVar10;
    (pNVar6->vFlowRefs).nCap = iVar16;
  }
  if (0 < iVar5) {
    memset((pNVar6->vFlowRefs).pArray,0,(uVar4 & 0xffffffff) << 2);
  }
  (pNVar6->vFlowRefs).nSize = iVar16;
  iVar5 = pGia->nObjs;
  uVar4 = (long)iVar5 * 2;
  iVar16 = (int)uVar4;
  if ((pNVar6->vRequired).nCap < iVar16) {
    piVar9 = (pNVar6->vRequired).pArray;
    sVar14 = (long)iVar5 << 3;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc(sVar14);
    }
    else {
      piVar9 = (int *)realloc(piVar9,sVar14);
    }
    (pNVar6->vRequired).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_0077abd1;
    (pNVar6->vRequired).nCap = iVar16;
  }
  if (0 < iVar5) {
    piVar9 = (pNVar6->vRequired).pArray;
    uVar12 = 0;
    do {
      piVar9[uVar12] = 0x3fffffff;
      uVar12 = uVar12 + 1;
    } while ((uVar4 & 0xffffffff) != uVar12);
  }
  (pNVar6->vRequired).nSize = iVar16;
  uVar1 = pGia->nObjs;
  if ((pNVar6->vCutSets).nCap < (int)uVar1) {
    piVar9 = (pNVar6->vCutSets).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (pNVar6->vCutSets).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_0077abd1;
    (pNVar6->vCutSets).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNVar6->vCutSets).pArray,0,(ulong)uVar1 * 4);
  }
  (pNVar6->vCutSets).nSize = uVar1;
  uVar1 = pGia->nObjs;
  if ((pNVar6->vCutFlows).nCap < (int)uVar1) {
    pfVar10 = (pNVar6->vCutFlows).pArray;
    if (pfVar10 == (float *)0x0) {
      pfVar10 = (float *)malloc((long)(int)uVar1 << 2);
    }
    else {
      pfVar10 = (float *)realloc(pfVar10,(long)(int)uVar1 << 2);
    }
    (pNVar6->vCutFlows).pArray = pfVar10;
    (pNVar6->vCutFlows).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNVar6->vCutFlows).pArray,0,(ulong)uVar1 * 4);
  }
  (pNVar6->vCutFlows).nSize = uVar1;
  uVar1 = pGia->nObjs;
  if ((pNVar6->vCutDelays).nCap < (int)uVar1) {
    piVar9 = (pNVar6->vCutDelays).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc((long)(int)uVar1 << 2);
    }
    else {
      piVar9 = (int *)realloc(piVar9,(long)(int)uVar1 << 2);
    }
    (pNVar6->vCutDelays).pArray = piVar9;
    if (piVar9 == (int *)0x0) goto LAB_0077abd1;
    (pNVar6->vCutDelays).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((pNVar6->vCutDelays).pArray,0,(ulong)uVar1 * 4);
  }
  (pNVar6->vCutDelays).nSize = uVar1;
  if ((pNVar6->vBackup).nCap < 1000) {
    piVar9 = (pNVar6->vBackup).pArray;
    if (piVar9 == (int *)0x0) {
      piVar9 = (int *)malloc(4000);
    }
    else {
      piVar9 = (int *)realloc(piVar9,4000);
    }
    (pNVar6->vBackup).pArray = piVar9;
    if (piVar9 == (int *)0x0) {
LAB_0077abd1:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pNVar6->vBackup).nCap = 1000;
  }
  vRefs = (Vec_Int_t *)malloc(0x10);
  vRefs->nCap = 0;
  vRefs->nSize = 0;
  vRefs->pArray = (int *)0x0;
  Mf_ManSetFlowRefs(pGia,vRefs);
  iVar5 = vRefs->nSize;
  if (0 < (long)iVar5) {
    piVar9 = vRefs->pArray;
    lVar13 = (long)(pNVar6->vFlowRefs).nSize;
    lVar15 = 0;
    do {
      if (lVar13 <= lVar15) {
LAB_0077abb2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      fVar17 = (float)*(int *)((long)piVar9 + lVar15 * 2);
      pfVar10 = (pNVar6->vFlowRefs).pArray;
      pfVar10[lVar15] = fVar17;
      if (lVar13 <= lVar15 + 1) goto LAB_0077abb2;
      pfVar10[lVar15 + 1] = fVar17;
      lVar15 = lVar15 + 2;
    } while ((long)iVar5 * 2 != lVar15);
  }
  if (vRefs->pArray != (int *)0x0) {
    free(vRefs->pArray);
    vRefs->pArray = (int *)0x0;
  }
  free(vRefs);
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  pJVar2 = pNVar6->pPars;
  Mio_LibraryMatchesFetch
            (pLib,&pNVar6->vTtMem,&pNVar6->vTt2Match,&pNVar6->pCells,&pNVar6->nCells,
             pJVar2->fPinFilter,pJVar2->fPinPerm,pJVar2->fPinQuick);
  pMVar3 = pNVar6->pCells;
  if (pMVar3 == (Mio_Cell2_t *)0x0) {
    pNVar6 = (Nf_Man_t *)0x0;
  }
  else {
    pNVar6->InvDelayI = pMVar3[3].iDelays[0];
    pNVar6->InvAreaW = pMVar3[3].AreaW;
    pNVar6->InvAreaF = pMVar3[3].AreaF;
    *(uint *)pNVar6->pNfObjs->M[0] = *(uint *)pNVar6->pNfObjs->M[0] & 0xfff00000;
    *(uint *)pNVar6->pNfObjs->M[1] = (*(uint *)pNVar6->pNfObjs->M[1] & 0xfff00000) + 1;
  }
  return pNVar6;
}

Assistant:

Nf_Man_t * Nf_StoCreate( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    extern void Mf_ManSetFlowRefs( Gia_Man_t * p, Vec_Int_t * vRefs );
    Vec_Int_t * vFlowRefs;
    Nf_Man_t * p;
    int i, Entry;
    assert( pPars->nCutNum > 1  && pPars->nCutNum <= NF_CUT_MAX );
    assert( pPars->nLutSize > 1 && pPars->nLutSize <= NF_LEAF_MAX );
    ABC_FREE( pGia->pRefs );
    Vec_IntFreeP( &pGia->vCellMapping );
    if ( Gia_ManHasChoices(pGia) )
        Gia_ManSetPhase(pGia);
    // create
    p = ABC_CALLOC( Nf_Man_t, 1 );
    p->clkStart = Abc_Clock();
    p->pGia     = pGia;
    p->pPars    = pPars;
    p->pNfObjs  = ABC_CALLOC( Nf_Obj_t, Gia_ManObjNum(pGia) );
    p->iCur     = 2;
    // other
    Vec_PtrGrow( &p->vPages, 256 );                                    // cut memory
    Vec_IntFill( &p->vMapRefs,  2*Gia_ManObjNum(pGia), 0 );            // mapping refs   (2x)
    Vec_FltFill( &p->vFlowRefs, 2*Gia_ManObjNum(pGia), 0 );            // flow refs      (2x)
    Vec_IntFill( &p->vRequired, 2*Gia_ManObjNum(pGia), SCL_INFINITY ); // required times (2x)
    Vec_IntFill( &p->vCutSets,  Gia_ManObjNum(pGia), 0 );              // cut offsets
    Vec_FltFill( &p->vCutFlows, Gia_ManObjNum(pGia), 0 );              // cut area
    Vec_IntFill( &p->vCutDelays,Gia_ManObjNum(pGia), 0 );              // cut delay
    Vec_IntGrow( &p->vBackup, 1000 );
    // references
    vFlowRefs = Vec_IntAlloc(0);
    Mf_ManSetFlowRefs( pGia, vFlowRefs );
    Vec_IntForEachEntry( vFlowRefs, Entry, i )
    {
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i,   /*0.5* */Entry );
        Vec_FltWriteEntry( &p->vFlowRefs, 2*i+1, /*0.5* */Entry );
    }
    Vec_IntFree(vFlowRefs);
    // matching
    Mio_LibraryMatchesFetch( (Mio_Library_t *)Abc_FrameReadLibGen(), &p->vTtMem, &p->vTt2Match, &p->pCells, &p->nCells, p->pPars->fPinFilter, p->pPars->fPinPerm, p->pPars->fPinQuick );
    if ( p->pCells == NULL )
        return NULL;
    p->InvDelayI = p->pCells[3].iDelays[0];
    p->InvAreaW  = p->pCells[3].AreaW;
    p->InvAreaF  = p->pCells[3].AreaF;
    Nf_ObjMatchD(p, 0, 0)->Gate = 0;
    Nf_ObjMatchD(p, 0, 1)->Gate = 1;
    // prepare cuts
    return p;
}